

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O0

int vkt::tessellation::referenceQuadNonPointModePrimitiveCount
              (SpacingMode spacingMode,int inner0,int inner1,int outer0,int outer1,int outer2,
              int outer3)

{
  int local_34;
  int local_2c;
  int outer2_local;
  int outer1_local;
  int outer0_local;
  int inner1_local;
  int inner0_local;
  SpacingMode spacingMode_local;
  
  if ((inner0 == 1) || (inner1 == 1)) {
    if ((inner0 == 1) &&
       ((((inner1 == 1 && (outer0 == 1)) && (outer1 == 1)) && ((outer2 == 1 && (outer3 == 1)))))) {
      inner0_local = 2;
    }
    else {
      local_2c = inner0;
      if ((inner0 < 2) && (local_2c = 2, spacingMode == SPACINGMODE_FRACTIONAL_ODD)) {
        local_2c = 3;
      }
      local_34 = inner1;
      if ((inner1 < 2) && (local_34 = 2, spacingMode == SPACINGMODE_FRACTIONAL_ODD)) {
        local_34 = 3;
      }
      inner0_local = referenceQuadNonPointModePrimitiveCount
                               (spacingMode,local_2c,local_34,outer0,outer1,outer2,outer3);
    }
  }
  else {
    inner0_local = (inner0 + -2) * 2 * (inner1 + -2) + (inner0 + -2) * 2 + (inner1 + -2) * 2 +
                   outer0 + outer1 + outer2 + outer3;
  }
  return inner0_local;
}

Assistant:

static int referenceQuadNonPointModePrimitiveCount (const SpacingMode spacingMode, const int inner0, const int inner1, const int outer0, const int outer1, const int outer2, const int outer3)
{
	if (inner0 == 1 || inner1 == 1)
	{
		if (inner0 == 1 && inner1 == 1 && outer0 == 1 && outer1 == 1 && outer2 == 1 && outer3 == 1)
			return 2;
		else
			return referenceQuadNonPointModePrimitiveCount(spacingMode, inner0 > 1 ? inner0 : spacingMode == SPACINGMODE_FRACTIONAL_ODD ? 3 : 2,
																		inner1 > 1 ? inner1 : spacingMode == SPACINGMODE_FRACTIONAL_ODD ? 3 : 2,
																		outer0, outer1, outer2, outer3);
	}
	else
		return 2*(inner0-2)*(inner1-2) + 2*(inner0-2) + 2*(inner1-2) + outer0+outer1+outer2+outer3;
}